

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void print_atomname(LispPTR index)

{
  LispPTR *pLVar1;
  ushort uVar2;
  DLword *pDVar3;
  bool bVar4;
  
  if ((index & 0xfff0000) == 0) {
    pLVar1 = (LispPTR *)(AtomSpace + (ulong)(index * 5) * 2);
  }
  else {
    pLVar1 = NativeAligned4FromLAddr(index);
  }
  print_package_name((uint)*(byte *)((long)pLVar1 + 0x13));
  uVar2 = (ushort)*(byte *)((ulong)(Lisp_world + (*pLVar1 & 0xfffffff)) ^ 3);
  pDVar3 = Lisp_world + (*pLVar1 & 0xfffffff);
  while( true ) {
    pDVar3 = (DLword *)((long)pDVar3 + 1);
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) break;
    putchar((uint)*(byte *)((ulong)pDVar3 ^ 3));
  }
  return;
}

Assistant:

void print_atomname(LispPTR index)
/* atomindex */
{
  char *pname;
  DLword length;
  PNCell *pnptr;

  pnptr = (PNCell *)GetPnameCell(index);
  print_package_name(pnptr->pkg_index);
  pname = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);

  length = (DLword)GETBYTE(pname++);

  while (length > 0) {
    putchar(GETBYTE(pname++));
    length--;
  }

}